

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O0

void __thiscall
Hydro::MacProjector::project
          (MacProjector *this,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi_inout,Real reltol,
          Real atol)

{
  int numcomp;
  Long LVar1;
  MultiFab **ppMVar2;
  MultiFab *in_RSI;
  MultiFab *in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int ilev_1;
  int ilev;
  int nlevs;
  Real in_stack_000000f0;
  Real in_stack_000000f8;
  MacProjector *in_stack_00000100;
  MultiFab *in_stack_ffffffffffffffb8;
  MultiFab *in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  int nghost;
  
  LVar1 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                    ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x74e1bd);
  numcomp = (int)LVar1;
  for (nghost = 0; nghost < numcomp; nghost = nghost + 1) {
    in_stack_ffffffffffffffc0 =
         amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                   ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                    in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    amrex::MultiFab::Copy
              (in_RSI,in_XMM0_Qa,(int)((ulong)in_XMM1_Qa >> 0x20),(int)in_XMM1_Qa,numcomp,nghost);
  }
  project(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  for (local_2c = 0; local_2c < numcomp; local_2c = local_2c + 1) {
    ppMVar2 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = *ppMVar2;
    amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    amrex::MultiFab::Copy
              (in_RSI,in_XMM0_Qa,(int)((ulong)in_XMM1_Qa >> 0x20),(int)in_XMM1_Qa,numcomp,nghost);
  }
  return;
}

Assistant:

void
MacProjector::project (const Vector<MultiFab*>& phi_inout, Real reltol, Real atol)
{
    const int nlevs = m_rhs.size();
    for (int ilev = 0; ilev < nlevs; ++ilev) {
        MultiFab::Copy(m_phi[ilev], *phi_inout[ilev], 0, 0, 1, 0);
    }

    project(reltol, atol);

    for (int ilev = 0; ilev < nlevs; ++ilev) {
        MultiFab::Copy(*phi_inout[ilev], m_phi[ilev], 0, 0, 1, 0);
    }
}